

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_algebra.h
# Opt level: O0

vec2 dja::normalize(vec2 *a)

{
  float_t b;
  vec2 vVar1;
  vec2 *a_local;
  
  b = norm(a);
  vVar1 = operator/(a,b);
  return vVar1;
}

Assistant:

V2 normalize(const V2& a) {return a / norm(a);}